

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cpp
# Opt level: O3

bool uci::parse_command(string *input)

{
  uint *puVar1;
  byte bVar2;
  unique_ptr<options,_std::default_delete<options>_> uVar3;
  size_type sVar4;
  char cVar5;
  bool bVar6;
  U8 UVar7;
  int iVar8;
  uint uVar9;
  istream *piVar10;
  ostream *poVar11;
  ulong uVar12;
  long *plVar13;
  char *__s;
  byte bVar14;
  Move *m;
  Move *m_00;
  size_t sVar15;
  byte bVar16;
  undefined8 uVar17;
  byte bVar18;
  _Alloc_hider _Var19;
  Move *pMVar20;
  long lVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  bool bVar23;
  float fVar24;
  int numThreads;
  string cmd;
  bool silent;
  Movegen mvs;
  istringstream instream;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588;
  string local_568;
  string local_548;
  undefined1 local_528 [20];
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int local_508;
  bool bStack_504;
  bool bStack_503;
  U8 UStack_502;
  U8 UStack_501;
  ios_base local_4b0 [768];
  long local_1b0 [3];
  uint auStack_198 [24];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)input,_S_in);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_local_buf[0] = '\0';
  paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_528 + 0x10);
LAB_00125932:
  do {
    while( true ) {
      puVar1 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
      *puVar1 = *puVar1 | 0x1000;
      piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8);
      sVar4 = local_5c8._M_string_length;
      _Var19._M_p = local_5c8._M_dataplus._M_p;
      bVar23 = ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0;
      if (bVar23) goto LAB_00126dc3;
      if (local_5c8._M_string_length != 0) {
        sVar15 = 0;
        do {
          iVar8 = tolower((int)_Var19._M_p[sVar15]);
          _Var19._M_p[sVar15] = (char)iVar8;
          sVar15 = sVar15 + 1;
        } while (sVar4 != sVar15);
      }
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"position");
      if ((iVar8 != 0) ||
         (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0)) break;
      local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
      local_5e8._M_string_length = 0;
      local_5e8.field_2._M_local_buf[0] = '\0';
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"startpos");
      if (iVar8 == 0) {
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                                (char)(istream *)local_1b0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_1b0,(string *)&local_5e8,cVar5);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_528,(string *)&START_FEN_abi_cxx11_,_S_in);
        position::setup(&uci_pos,(istringstream *)local_528);
        load_position(&local_5e8);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_528);
        std::ios_base::~ios_base(local_4b0);
      }
      else {
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"");
        while ((piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
               ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0 &&
               (iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_5c8,"moves"), iVar8 != 0))) {
          local_528._0_8_ = paVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_528,local_5c8._M_dataplus._M_p,
                     local_5c8._M_dataplus._M_p + local_5c8._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528,
                     " ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_5a8,(char *)local_528._0_8_,local_528._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._0_8_ != paVar22) {
            operator_delete((void *)local_528._0_8_,stack0xfffffffffffffae8 + 1);
          }
        }
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                                (char)(istream *)local_1b0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_1b0,(string *)&local_5e8,cVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_528,"moves ",&local_5e8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_5e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._0_8_ != paVar22) {
          operator_delete((void *)local_528._0_8_,stack0xfffffffffffffae8 + 1);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_528,(string *)&local_5a8,_S_in);
        position::setup(&uci_pos,(istringstream *)local_528);
        load_position(&local_5e8);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_528);
        std::ios_base::~ios_base(local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        uVar17 = CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                          local_5e8.field_2._M_local_buf[0]);
        _Var19._M_p = local_5e8._M_dataplus._M_p;
LAB_00125eb1:
        operator_delete(_Var19._M_p,uVar17 + 1);
      }
    }
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_5c8,"setoption");
    if ((iVar8 == 0) &&
       ((piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0 &&
        (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)))) {
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"hash");
      if (((iVar8 == 0) &&
          (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
          ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
         (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
        iVar8 = atoi(local_5c8._M_dataplus._M_p);
        uVar3 = opts;
        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"hashsize","");
        options::set<int>((options *)
                          uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                          _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                          super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_588,iVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        hash_table::resize(&ttable,(long)iVar8);
        bVar23 = true;
        goto LAB_00126dc6;
      }
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"clear");
      if (((iVar8 == 0) &&
          (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
          ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
         (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_5c8,"hash"), iVar8 == 0)) {
        hash_table::clear(&ttable);
      }
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"threads");
      if (((iVar8 == 0) &&
          (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
          ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
         (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8), uVar3 = opts,
         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
        paVar22 = &local_548.field_2;
        local_548._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"threads","");
        iVar8 = atoi(local_5c8._M_dataplus._M_p);
        options::set<int>((options *)
                          uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                          _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                          super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_548,iVar8);
        _Var19._M_p = local_548._M_dataplus._M_p;
        goto LAB_00126db3;
      }
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"multipv");
      if (((iVar8 == 0) &&
          (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
          ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
         (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8), uVar3 = opts,
         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
        paVar22 = &local_568.field_2;
        local_568._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"multipv","");
        iVar8 = atoi(local_5c8._M_dataplus._M_p);
        options::set<int>((options *)
                          uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                          _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                          super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_568,iVar8);
        _Var19._M_p = local_568._M_dataplus._M_p;
LAB_00126db3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var19._M_p != paVar22) {
          operator_delete(_Var19._M_p,paVar22->_M_allocated_capacity + 1);
        }
LAB_00126dc3:
        bVar23 = true;
LAB_00126dc6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,
                          CONCAT71(local_5c8.field_2._M_allocated_capacity._1_7_,
                                   local_5c8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
        return bVar23;
      }
      goto LAB_00125932;
    }
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_5c8,"d");
    if (iVar8 == 0) {
      position::print(&uci_pos);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"position hash key: ",0x13);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fen: ",5);
      position::to_fen_abi_cxx11_((string *)local_528,&uci_pos);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_528._0_8_,local_528._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      uVar17 = stack0xfffffffffffffae8;
      _Var19._M_p = (pointer)local_528._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != paVar22) goto LAB_00125eb1;
      goto LAB_00125932;
    }
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_5c8,"eval");
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5c8,"undo");
      if (iVar8 == 0) {
        position::undo_move(&uci_pos,&dbgmove);
      }
      else {
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_5c8,"fdepth");
        if ((iVar8 == 0) &&
           (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
           ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
          uci_pos.params.fixed_depth = atoi(local_5c8._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"fixed depth search: ",0x14);
          poVar11 = (ostream *)
                    std::ostream::operator<<((ostream *)&std::cout,uci_pos.params.fixed_depth);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          goto LAB_00126113;
        }
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_5c8,"see");
        if ((iVar8 == 0) &&
           (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
           ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
          Movegen::Movegen((Movegen *)local_528,&uci_pos);
          Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)local_528);
          local_5a8._M_dataplus._M_p._0_3_ = (Move)0x110000;
          if (0 < (int)local_528._0_4_) {
            pMVar20 = (Move *)(local_528 + 4);
            lVar21 = 0;
            do {
              bVar23 = position::is_legal(&uci_pos,pMVar20);
              if (bVar23) {
                move_to_string_abi_cxx11_(&local_5e8,(uci *)pMVar20,m);
                _Var19._M_p = local_5e8._M_dataplus._M_p;
                if (local_5e8._M_string_length == local_5c8._M_string_length) {
                  if (local_5e8._M_string_length == 0) {
                    bVar23 = true;
                  }
                  else {
                    iVar8 = bcmp(local_5e8._M_dataplus._M_p,local_5c8._M_dataplus._M_p,
                                 local_5e8._M_string_length);
                    bVar23 = iVar8 == 0;
                  }
                }
                else {
                  bVar23 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var19._M_p != &local_5e8.field_2) {
                  operator_delete(_Var19._M_p,
                                  CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                                           local_5e8.field_2._M_local_buf[0]) + 1);
                }
                if (bVar23) {
                  UVar7 = pMVar20->type;
                  local_5a8._M_dataplus._M_p._0_3_ = *pMVar20;
                  goto LAB_00126ad5;
                }
              }
              lVar21 = lVar21 + 1;
              pMVar20 = pMVar20 + 1;
            } while (lVar21 < (int)local_528._0_4_);
            UVar7 = local_5a8._M_dataplus._M_p._2_1_;
LAB_00126ad5:
            if (UVar7 != '\x11') {
              iVar8 = position::see_move(&uci_pos,(Move *)&local_5a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"See score:  ",0xc);
              plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
              std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
              std::ostream::put((char)plVar13);
              std::ostream::flush();
              goto LAB_00126b8a;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," (dbg) See : error, illegal move.",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
        }
        else {
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_5c8,"domove");
          if ((iVar8 != 0) ||
             (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
             ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0)) {
            iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_5c8,"debug");
            if (iVar8 == 0) {
              uci_pos.debug_search = (bool)(uci_pos.debug_search ^ 1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"debugging set to: ",0x12);
              poVar11 = std::ostream::_M_insert<bool>(true);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            }
            else {
              iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_5c8,"isready");
              if (iVar8 != 0) {
                if (((Search::searching & 1) == 0) &&
                   (iVar8 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5c8,"go"), iVar8 == 0)) {
                  stack0xfffffffffffffae8 = 0;
                  _iStack_510 = 0;
                  local_528._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_528._8_8_ = 0;
                  local_508._0_1_ = '\0';
                  local_508._1_1_ = '\0';
                  local_508._2_1_ = '\0';
                  local_508._3_1_ = '\0';
                  bStack_504 = false;
                  bStack_503 = false;
                  UStack_502 = '\0';
                  UStack_501 = '\0';
                  while (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
                        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
                    iVar8 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5c8,"wtime");
                    if ((iVar8 == 0) &&
                       (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
                       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                      iVar8 = atoi(local_5c8._M_dataplus._M_p);
                      local_528._0_4_ = iVar8;
                    }
                    else {
                      iVar8 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(&local_5c8,"btime");
                      if ((iVar8 == 0) &&
                         (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
                         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                        iVar8 = atoi(local_5c8._M_dataplus._M_p);
                        local_528._4_4_ = iVar8;
                      }
                      else {
                        iVar8 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_5c8,"winc");
                        if ((iVar8 == 0) &&
                           (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
                           ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                          iVar8 = atoi(local_5c8._M_dataplus._M_p);
                          local_528._8_4_ = iVar8;
                        }
                        else {
                          iVar8 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare(&local_5c8,"binc");
                          if ((iVar8 == 0) &&
                             (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8),
                             ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0))
                          {
                            iVar8 = atoi(local_5c8._M_dataplus._M_p);
                            local_528._12_4_ = iVar8;
                          }
                          else {
                            iVar8 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::compare(&local_5c8,"movestogo");
                            if ((iVar8 == 0) &&
                               (piVar10 = std::operator>>((istream *)local_1b0,(string *)&local_5c8)
                               , ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) ==
                                 0)) {
                              iVar8 = atoi(local_5c8._M_dataplus._M_p);
                              local_528._16_4_ = iVar8;
                            }
                            else {
                              iVar8 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::compare(&local_5c8,"nodes");
                              if ((iVar8 == 0) &&
                                 (piVar10 = std::operator>>((istream *)local_1b0,
                                                            (string *)&local_5c8),
                                 ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) ==
                                 0)) {
                                iVar8 = atoi(local_5c8._M_dataplus._M_p);
                                iStack_514 = iVar8;
                              }
                              else {
                                iVar8 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::compare(&local_5c8,"movetime");
                                if ((iVar8 == 0) &&
                                   (piVar10 = std::operator>>((istream *)local_1b0,
                                                              (string *)&local_5c8),
                                   ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5)
                                   == 0)) {
                                  iVar8 = atoi(local_5c8._M_dataplus._M_p);
                                  iStack_510 = iVar8;
                                }
                                else {
                                  iVar8 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          ::compare(&local_5c8,"mate");
                                  if ((iVar8 == 0) &&
                                     (piVar10 = std::operator>>((istream *)local_1b0,
                                                                (string *)&local_5c8),
                                     ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5)
                                     == 0)) {
                                    iVar8 = atoi(local_5c8._M_dataplus._M_p);
                                    iStack_50c = iVar8;
                                  }
                                  else {
                                    iVar8 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::compare(&local_5c8,"depth");
                                    if ((iVar8 == 0) &&
                                       (piVar10 = std::operator>>((istream *)local_1b0,
                                                                  (string *)&local_5c8),
                                       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] &
                                       5) == 0)) {
                                      iVar8 = atoi(local_5c8._M_dataplus._M_p);
                                      local_508 = iVar8;
                                    }
                                    else {
                                      iVar8 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              ::compare(&local_5c8,"infinite");
                                      if (iVar8 == 0) {
                                        iVar8 = std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                ::compare(&local_5c8,"infinite");
                                        bStack_504 = iVar8 == 0;
                                      }
                                      else {
                                        iVar8 = std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                ::compare(&local_5c8,"ponder");
                                        if (iVar8 == 0) {
                                          iVar8 = atoi(local_5c8._M_dataplus._M_p);
                                          bStack_503 = iVar8 != 0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  uVar9 = options::value<int>((options *)
                                              opts._M_t.
                                              super___uniq_ptr_impl<options,_std::default_delete<options>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>
                                              .super__Head_base<0UL,_options_*,_false>._M_head_impl,
                                              "threads");
                  uVar12 = (ulong)uVar9;
                  if ((int)uVar9 < 2) {
                    uVar12 = 1;
                  }
                  local_5e8._M_dataplus._M_p._0_4_ = (int)uVar12;
                  if ((long)SearchThreads.workers.
                            super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)SearchThreads.workers.
                            super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3 != uVar12) {
                    Threadpool<Searchthread>::init(&SearchThreads,(EVP_PKEY_CTX *)&local_5e8);
                  }
                  local_5a8._M_dataplus._M_p = local_5a8._M_dataplus._M_p & 0xffffffffffffff00;
                  Threadpool<Workerthread>::
                  enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
                            (&worker,Search::start,&uci_pos,(limits *)local_528,(bool *)&local_5a8);
                }
                else {
                  iVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_5c8,"stop");
                  if (iVar8 == 0) {
                    UCI_SIGNALS.stop = true;
                  }
                  else {
                    iVar8 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5c8,"moves");
                    if (iVar8 == 0) {
                      Movegen::Movegen((Movegen *)local_528,&uci_pos);
                      Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)local_528);
                      if (0 < (int)local_528._0_4_) {
                        pMVar20 = (Move *)(local_528 + 4);
                        lVar21 = 0;
                        do {
                          bVar23 = position::is_legal(&uci_pos,pMVar20);
                          if (bVar23) {
                            move_to_string_abi_cxx11_(&local_5e8,(uci *)pMVar20,m_00);
                            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,local_5e8._M_dataplus._M_p,
                                                 local_5e8._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                              operator_delete(local_5e8._M_dataplus._M_p,
                                              CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_
                                                       ,local_5e8.field_2._M_local_buf[0]) + 1);
                            }
                          }
                          lVar21 = lVar21 + 1;
                          pMVar20 = pMVar20 + 1;
                        } while (lVar21 < (int)local_528._0_4_);
                      }
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                      std::ostream::put(-0x58);
                      std::ostream::flush();
                      goto LAB_00126b8a;
                    }
                    iVar8 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5c8,"ucinewgame");
                    if (iVar8 == 0) {
                      hash_table::clear(&ttable);
                      position::clear(&uci_pos);
                    }
                    else {
                      iVar8 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(&local_5c8,"uci");
                      if (iVar8 == 0) {
                        hash_table::clear(&ttable);
                        position::clear(&uci_pos);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"id name haVoc",0xd);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"id author M.Glatzmaier",0x16);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "option name Threads type spin default 1 min 1 max 1024",0x36);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "option name Hash type spin default 1024 min 1 max 33554432",0x3a
                                  );
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "option name MultiPV type spin default 1 min 1 max 4",0x33);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"uciok",5);
                        poVar11 = (ostream *)&std::cout;
                      }
                      else {
                        iVar8 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_5c8,"exit");
                        if ((iVar8 == 0) ||
                           (iVar8 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::compare(&local_5c8,"quit"), iVar8 == 0)) goto LAB_00126dc6;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"unknown command: ",0x11);
                        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,local_5c8._M_dataplus._M_p,
                                             local_5c8._M_string_length);
                      }
                      std::endl<char,std::char_traits<char>>(poVar11);
                    }
                  }
                }
                goto LAB_00125932;
              }
              hash_table::clear(&ttable);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"readyok",7);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              poVar11 = (ostream *)&std::cout;
            }
LAB_00126113:
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            goto LAB_00125932;
          }
          Movegen::Movegen((Movegen *)local_528,&uci_pos);
          Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)local_528);
          if (0 < (int)local_528._0_4_) {
            lVar21 = 0;
            pMVar20 = (Move *)(local_528 + 4);
            bVar23 = false;
            do {
              bVar6 = position::is_legal(&uci_pos,pMVar20);
              if (bVar6) {
                std::operator+(&local_5e8,SanSquares_abi_cxx11_ + pMVar20->f,
                               SanSquares_abi_cxx11_ + pMVar20->t);
                local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"");
                bVar2 = pMVar20->type;
                if (bVar2 < 4) {
                  bVar18 = 2;
                  bVar16 = 1;
                  bVar14 = 0;
LAB_001262bb:
                  __s = "b";
                  if (bVar2 != bVar18) {
                    __s = "n";
                  }
                  if (bVar2 == bVar16) {
                    __s = "r";
                  }
                  if (bVar2 == bVar14) {
                    __s = "q";
                  }
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace(&local_5a8,0,local_5a8._M_string_length,__s,1);
                }
                else if (bVar2 < 8) {
                  bVar18 = 6;
                  bVar16 = 5;
                  bVar14 = 4;
                  goto LAB_001262bb;
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_5e8,local_5a8._M_dataplus._M_p,local_5a8._M_string_length);
                if ((local_5e8._M_string_length == local_5c8._M_string_length) &&
                   ((local_5e8._M_string_length == 0 ||
                    (iVar8 = bcmp(local_5e8._M_dataplus._M_p,local_5c8._M_dataplus._M_p,
                                  local_5e8._M_string_length), iVar8 == 0)))) {
                  dbgmove.f = pMVar20->f;
                  dbgmove.type = pMVar20->type;
                  dbgmove.t = pMVar20->t;
                  bVar6 = true;
                  bVar23 = true;
                }
                else {
                  bVar6 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                  operator_delete(local_5a8._M_dataplus._M_p,
                                  local_5a8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                  operator_delete(local_5e8._M_dataplus._M_p,
                                  CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                                           local_5e8.field_2._M_local_buf[0]) + 1);
                }
                if (bVar6) break;
              }
              lVar21 = lVar21 + 1;
              pMVar20 = pMVar20 + 1;
            } while (lVar21 < (int)local_528._0_4_);
            if (bVar23) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"doing mv ",9);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              std::ostream::flush();
              position::do_move(&uci_pos,&dbgmove);
              goto LAB_00126b8a;
            }
          }
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_5c8._M_dataplus._M_p,
                               local_5c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," is not a legal move",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
LAB_00126b8a:
        Movegen::~Movegen((Movegen *)local_528);
      }
      goto LAB_00125932;
    }
    position::print(&uci_pos);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"position hash key: ",0x13);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"evaluation: ",0xc);
    local_528._0_4_ = 0xbf800000;
    fVar24 = eval::evaluate(&uci_pos,*SearchThreads.workers.
                                      super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(float *)local_528);
    poVar11 = std::ostream::_M_insert<double>((double)fVar24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  } while( true );
}

Assistant:

bool uci::parse_command(const std::string& input) {
	std::istringstream instream(input);
	std::string cmd;
	bool running = true;

	while (instream >> std::skipws >> cmd) {
		std::transform(cmd.begin(), cmd.end(), cmd.begin(), ::tolower);

		if (cmd == "position" && instream >> cmd) {

			std::string tmp;
			if (cmd == "startpos") {
				getline(instream, tmp);
				std::istringstream fen(START_FEN);
				uci_pos.setup(fen);
				load_position(tmp);
			}
			else {
				std::string sfen = "";
				while ((instream >> cmd) && cmd != "moves") sfen += cmd + " ";
				getline(instream, tmp);
				tmp = "moves " + tmp;
				std::istringstream fen(sfen);
				uci_pos.setup(fen);
				load_position(tmp);
			}
		}
		else if (cmd == "setoption" && instream >> cmd && instream >> cmd)
		{
			if (cmd == "hash" && instream >> cmd && instream >> cmd)
			{
				auto sz = atoi(cmd.c_str());
				opts->set("hashsize", sz);
				ttable.resize(sz);
				break;
			}
			if (cmd == "clear" && instream >> cmd)
			{
				if (cmd == "hash")
					ttable.clear();
			}
			if (cmd == "threads" && instream >> cmd && instream >> cmd)
			{
				opts->set("threads", atoi(cmd.c_str()));
				break;
			}
			if (cmd == "multipv" && instream >> cmd && instream >> cmd)
			{
				opts->set("multipv", atoi(cmd.c_str()));
				break;
			}
		}
		else if (cmd == "d") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "fen: " << uci_pos.to_fen() << std::endl;
		}
		else if (cmd == "eval") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "evaluation: " << eval::evaluate(uci_pos, *SearchThreads[0], -1) << std::endl;
		}
		else if (cmd == "undo") {
			uci_pos.undo_move(dbgmove);
		}
		else if (cmd == "fdepth" && instream >> cmd) {
			uci_pos.params.fixed_depth = atoi(cmd.c_str());
			std::cout << "fixed depth search: " << uci_pos.params.fixed_depth << std::endl;
		}

		else if (cmd == "see" && instream >> cmd) {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			Move move;


			for (int i = 0; i < mvs.size(); ++i) {

				if (!uci_pos.is_legal(mvs[i])) continue;

				if (move_to_string(mvs[i]) == cmd) {
					move = mvs[i];
					break;
				}

			}

			if (move.type != Movetype::no_type) {
				int score = uci_pos.see_move(move);
				std::cout << "See score:  " << score << std::endl;
			}
			else std::cout << " (dbg) See : error, illegal move." << std::endl;
		}
		//else if (cmd == "evaltune") {
		//	auto& tm = haVoc::Tuningmanager::instance();
		//	tm.tune_evaluation();
		//}
		else if (cmd == "domove" && instream >> cmd) {
			Movegen mvs(uci_pos);
			bool isok = false;
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) continue;
				std::string tmp = SanSquares[mvs[i].f] + SanSquares[mvs[i].t];
				std::string ps = "";
				Movetype t = Movetype(mvs[i].type);

				if (t >= 0 && t < capture_promotion_q) {
					ps = (t == 0 ? "q" :
						t == 1 ? "r" :
						t == 2 ? "b" : "n");
				}
				else if (t >= capture_promotion_q && t < castle_ks) {
					ps = (t == 4 ? "q" :
						t == 5 ? "r" :
						t == 6 ? "b" : "n");
				}
				tmp += ps;

				if (tmp == cmd) {
					dbgmove.set(mvs[i].f, mvs[i].t, Movetype(mvs[i].type));
					isok = true;
					break;
				}
			}
			if (isok) {
				std::cout << "doing mv " << std::endl;
				uci_pos.do_move(dbgmove);
			}
			else std::cout << cmd << " is not a legal move" << std::endl;
		}
		else if (cmd == "debug") {
			uci_pos.debug_search = !uci_pos.debug_search;
			std::cout << "debugging set to: " << uci_pos.debug_search << std::endl;
		}

		// game specific uci commands (refactor?)
		else if (cmd == "isready") {
			ttable.clear();
			std::cout << "readyok" << std::endl;
		}
		else if (!Search::searching && cmd == "go") {
			limits lims;
			memset(&lims, 0, sizeof(limits));

			while (instream >> cmd)
			{
				if (cmd == "wtime" && instream >> cmd) lims.wtime = atoi(cmd.c_str());
				else if (cmd == "btime" && instream >> cmd) lims.btime = atoi(cmd.c_str());
				else if (cmd == "winc" && instream >> cmd) lims.winc = atoi(cmd.c_str());
				else if (cmd == "binc" && instream >> cmd) lims.binc = atoi(cmd.c_str());
				else if (cmd == "movestogo" && instream >> cmd) lims.movestogo = atoi(cmd.c_str());
				else if (cmd == "nodes" && instream >> cmd) lims.nodes = atoi(cmd.c_str());
				else if (cmd == "movetime" && instream >> cmd) lims.movetime = atoi(cmd.c_str());
				else if (cmd == "mate" && instream >> cmd) lims.mate = atoi(cmd.c_str());
				else if (cmd == "depth" && instream >> cmd) lims.depth = atoi(cmd.c_str());
				else if (cmd == "infinite") lims.infinite = (cmd == "infinite" ? true : false);
				else if (cmd == "ponder") lims.ponder = atoi(cmd.c_str());
			}

			// Set search threads
			int numThreads = std::max(opts->value<int>("threads"), 1);
			if (numThreads != SearchThreads.num_workers())
				SearchThreads.init(numThreads);

			bool silent = false;
			worker.enqueue(Search::start, uci_pos, lims, silent);
		}
		else if (cmd == "stop") {
			UCI_SIGNALS.stop = true;
		}
		else if (cmd == "moves") {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) 
					continue;
				std::cout << move_to_string(mvs[i]) << " ";
			}
			std::cout << std::endl;
		}
		else if (cmd == "ucinewgame") {
			ttable.clear();
			uci_pos.clear();
		}
		else if (cmd == "uci") {
			ttable.clear();
			uci_pos.clear();
			std::cout << "id name haVoc" << std::endl;
			std::cout << "id author M.Glatzmaier" << std::endl;
			std::cout << "option name Threads type spin default 1 min 1 max 1024" << std::endl;
			std::cout << "option name Hash type spin default 1024 min 1 max 33554432" << std::endl;
			std::cout << "option name MultiPV type spin default 1 min 1 max 4" << std::endl;
			std::cout << "uciok" << std::endl;
		}

		else if (cmd == "exit" || cmd == "quit") {
			running = false;
			break;
		}
		else std::cout << "unknown command: " << cmd << std::endl;

	}
	return running;
}